

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jint Java_beagle_BeagleJNIWrapper_updateTransitionMatrices
               (JNIEnv *env,jobject obj,jint instance,jint eigenIndex,jintArray inProbabilityIndices
               ,jintArray inFirstDerivativeIndices,jintArray inSecondDerivativeIndices,
               jdoubleArray inEdgeLengths,jint count)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jdouble *pjVar4;
  jint *local_50;
  
  local_50 = (jint *)0x0;
  pjVar2 = (*env->functions->GetIntArrayElements)(env,inProbabilityIndices,(jboolean *)0x0);
  if (inFirstDerivativeIndices != (jintArray)0x0) {
    local_50 = (*env->functions->GetIntArrayElements)(env,inFirstDerivativeIndices,(jboolean *)0x0);
  }
  if (inSecondDerivativeIndices == (jintArray)0x0) {
    pjVar3 = (jint *)0x0;
  }
  else {
    pjVar3 = (*env->functions->GetIntArrayElements)(env,inSecondDerivativeIndices,(jboolean *)0x0);
  }
  pjVar4 = (*env->functions->GetDoubleArrayElements)(env,inEdgeLengths,(jboolean *)0x0);
  jVar1 = beagleUpdateTransitionMatrices(instance,eigenIndex,pjVar2,local_50,pjVar3,pjVar4,count);
  (*env->functions->ReleaseDoubleArrayElements)(env,inEdgeLengths,pjVar4,2);
  if (inSecondDerivativeIndices != (jintArray)0x0) {
    (*env->functions->ReleaseIntArrayElements)(env,inSecondDerivativeIndices,pjVar3,2);
  }
  if (inFirstDerivativeIndices != (jintArray)0x0) {
    (*env->functions->ReleaseIntArrayElements)(env,inFirstDerivativeIndices,local_50,2);
  }
  (*env->functions->ReleaseIntArrayElements)(env,inProbabilityIndices,pjVar2,2);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_updateTransitionMatrices
  (JNIEnv *env, jobject obj, jint instance, jint eigenIndex, jintArray inProbabilityIndices, jintArray inFirstDerivativeIndices, jintArray inSecondDerivativeIndices, jdoubleArray inEdgeLengths, jint count)
{
    jint *probabilityIndices = env->GetIntArrayElements(inProbabilityIndices, NULL);
    jint *firstDerivativeIndices = inFirstDerivativeIndices != NULL ? env->GetIntArrayElements(inFirstDerivativeIndices, NULL) : NULL;
    jint *secondDerivativeIndices = inSecondDerivativeIndices != NULL ? env->GetIntArrayElements(inSecondDerivativeIndices, NULL) : NULL;
    jdouble *edgeLengths = env->GetDoubleArrayElements(inEdgeLengths, NULL);
    jint errCode = (jint)beagleUpdateTransitionMatrices(instance, eigenIndex, (int *)probabilityIndices, (int *)firstDerivativeIndices, (int *)secondDerivativeIndices, (double *)edgeLengths, count);

    env->ReleaseDoubleArrayElements(inEdgeLengths, edgeLengths, JNI_ABORT);
    if (inSecondDerivativeIndices != NULL) env->ReleaseIntArrayElements(inSecondDerivativeIndices, secondDerivativeIndices, JNI_ABORT);
    if (inFirstDerivativeIndices != NULL) env->ReleaseIntArrayElements(inFirstDerivativeIndices, firstDerivativeIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inProbabilityIndices, probabilityIndices, JNI_ABORT);

    return errCode;
}